

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

char * minihttp::Download(char *url,size_t *sz,POST *post)

{
  bool bVar1;
  DLSocket dl;
  allocator<char> local_299;
  string local_298;
  undefined1 local_278 [563];
  undefined2 local_45;
  char *local_40;
  size_t local_38;
  bool local_28;
  bool local_27;
  
  if (_networkInitDone == '\0') {
    _networkInitDone = '\x01';
  }
  DLSocket::DLSocket((DLSocket *)local_278);
  TcpSocket::SetBufsizeIn((TcpSocket *)local_278,0x10000);
  local_278[0x30] = false;
  _SetNonBlocking(local_278._56_8_,false);
  local_45._0_1_ = true;
  local_45._1_1_ = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"minihttp",&local_299);
  std::__cxx11::string::_M_assign((string *)(local_278 + 0x68));
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,url,&local_299);
  HttpSocket::Download((HttpSocket *)local_278,&local_298,(char *)0x0,(void *)0x0,post);
  std::__cxx11::string::~string((string *)&local_298);
  while ((local_278._56_8_ != -1 ||
         (bVar1 = HttpSocket::HasPendingTask((HttpSocket *)local_278), bVar1))) {
    TcpSocket::update((TcpSocket *)local_278);
  }
  if ((local_28 == true) && (local_27 != true)) {
    if (sz != (size_t *)0x0) {
      *sz = local_38;
    }
  }
  else {
    free(local_40);
    local_40 = (char *)0x0;
  }
  HttpSocket::~HttpSocket((HttpSocket *)local_278);
  return local_40;
}

Assistant:

char *Download(const char *url, size_t *sz, const POST *post /* = NULL */)
{
    if(!_networkInitDone)
        if(!InitNetwork())
            return NULL;

    DLSocket dl;
    dl.SetBufsizeIn(64 * 1024);
    dl.SetNonBlocking(false);
    dl.SetFollowRedirect(true);
    dl.SetAlwaysHandle(false);
    dl.SetUserAgent("minihttp");
    dl.Download(url, NULL, NULL, post);

    while(dl.isOpen() || dl.HasPendingTask())
        dl.update();

    if(!dl.finished || dl.fail)
    {
        free(dl.buf);
        return NULL;
    }

    if(sz)
        *sz = dl.bufsz;

    // FIXME: if the body is empty (aka the HTTP reply contained entirely of headers only), buf was not allocated and is still NULL.
    // Might want to return 1 malloc'd zero byte in that case?
    return dl.buf;
}